

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFile(DescriptorPool *this,FileDescriptorProto *proto)

{
  LogMessage *pLVar1;
  FileDescriptor *pFVar2;
  LogMessage local_150;
  LogMessage local_118;
  DescriptorBuilder local_e0;
  
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    internal::LogMessage::LogMessage
              (&local_118,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x9c5);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_118,"CHECK failed: fallback_database_ == NULL: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Cannot call BuildFile on a DescriptorPool that uses a DescriptorDatabase.  You must instead find a way to get your file into the underlying database."
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar1);
    internal::LogMessage::~LogMessage(&local_118);
  }
  if (this->mutex_ != (Mutex *)0x0) {
    internal::LogMessage::LogMessage
              (&local_150,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x9c9);
    pLVar1 = internal::LogMessage::operator<<(&local_150,"CHECK failed: mutex_ == NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_e0,pLVar1);
    internal::LogMessage::~LogMessage(&local_150);
  }
  local_e0.tables_ = (this->tables_).ptr_;
  local_e0.filename_._M_dataplus._M_p = (pointer)&local_e0.filename_.field_2;
  local_e0.error_collector_ = (ErrorCollector *)0x0;
  local_e0.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.options_to_interpret_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0.had_errors_ = false;
  local_e0.filename_._M_string_length = 0;
  local_e0.filename_.field_2._M_local_buf[0] = '\0';
  local_e0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0.possible_undeclared_dependency_name_._M_dataplus._M_p =
       (pointer)&local_e0.possible_undeclared_dependency_name_.field_2;
  local_e0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0.possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  local_e0.possible_undeclared_dependency_name_._M_string_length = 0;
  local_e0.possible_undeclared_dependency_name_.field_2._M_local_buf[0] = '\0';
  local_e0.pool_ = this;
  local_e0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0.dependencies_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar2 = DescriptorBuilder::BuildFile(&local_e0,proto);
  DescriptorBuilder::~DescriptorBuilder(&local_e0);
  return pFVar2;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFile(
    const FileDescriptorProto& proto) {
  GOOGLE_CHECK(fallback_database_ == NULL)
    << "Cannot call BuildFile on a DescriptorPool that uses a "
       "DescriptorDatabase.  You must instead find a way to get your file "
       "into the underlying database.";
  GOOGLE_CHECK(mutex_ == NULL);   // Implied by the above GOOGLE_CHECK.
  return DescriptorBuilder(this, tables_.get(), NULL).BuildFile(proto);
}